

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::DescriptorSet::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  int *piVar1;
  deUint32 dVar2;
  uint uVar3;
  Resources *pRVar4;
  const_iterator cur;
  Parameters *pPVar5;
  Parameters *params_00;
  deUint32 type;
  long lVar6;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> typeCounts;
  deUint32 countByType [11];
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_b8;
  Resources *local_98;
  VkDescriptorPoolSize local_90;
  undefined4 local_88;
  deUint32 local_84;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_80;
  Move<vk::Handle<(vk::HandleType)21>_> local_68;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  dVar2 = env->maxResourceConsumers;
  pPVar5 = (Parameters *)
           (params->descriptorSetLayout).bindings.
           super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  params_00 = (Parameters *)
              (params->descriptorSetLayout).bindings.
              super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator._0_4_ = 0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator._4_4_ = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  for (; pPVar5 != params_00;
      pPVar5 = (Parameters *)
               ((long)&(pPVar5->poolSizes).
                       super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4)) {
    piVar1 = (int *)((long)&local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
                            m_internal + (ulong)pPVar5->maxSets * 4);
    *piVar1 = *piVar1 + *(int *)&(pPVar5->poolSizes).
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_start * dVar2;
  }
  lVar6 = 0;
  local_98 = this;
  do {
    uVar3 = *(uint *)((long)&local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
                             m_internal + lVar6 * 4);
    if (uVar3 != 0) {
      local_90 = (VkDescriptorPoolSize)(((ulong)uVar3 << 0x20) + lVar6);
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
      emplace_back<vk::VkDescriptorPoolSize>(&local_b8,&local_90);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xb);
  local_88 = 1;
  local_84 = dVar2;
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
            (&local_80,&local_b8);
  DescriptorPool::create(&local_68,env,(Resources *)&local_88,params_00);
  pRVar4 = local_98;
  (local_98->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_device = local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  (local_98->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                CONCAT44(local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                         m_allocator._4_4_,
                         local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                         m_allocator._0_4_);
  (local_98->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
  m_internal = local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  (local_98->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  if (local_80.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::Dependency
            (&pRVar4->descriptorSetLayout,env,&params->descriptorSetLayout);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: descriptorPool		(env, DescriptorPool::Parameters(VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, env.maxResourceConsumers, computePoolSizes(params.descriptorSetLayout, env.maxResourceConsumers)))
			, descriptorSetLayout	(env, params.descriptorSetLayout)
		{
		}